

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::TimeZoneNames::getDisplayName
          (TimeZoneNames *this,UnicodeString *tzID,UTimeZoneNameType type,UDate date,
          UnicodeString *name)

{
  UnicodeString mzID;
  UChar mzIDBuf [32];
  
  (*(this->super_UObject)._vptr_UObject[10])();
  if ((ushort)(name->fUnion).fStackFields.fLengthAndFlags < 0x20) {
    UnicodeString::UnicodeString(&mzID,mzIDBuf,0,0x20);
    (*(this->super_UObject)._vptr_UObject[7])(date,this,tzID,&mzID);
    (*(this->super_UObject)._vptr_UObject[9])(this,&mzID,(ulong)type,name);
    UnicodeString::~UnicodeString(&mzID);
  }
  return name;
}

Assistant:

UnicodeString&
TimeZoneNames::getDisplayName(const UnicodeString& tzID, UTimeZoneNameType type, UDate date, UnicodeString& name) const {
    getTimeZoneDisplayName(tzID, type, name);
    if (name.isEmpty()) {
        UChar mzIDBuf[32];
        UnicodeString mzID(mzIDBuf, 0, UPRV_LENGTHOF(mzIDBuf));
        getMetaZoneID(tzID, date, mzID);
        getMetaZoneDisplayName(mzID, type, name);
    }
    return name;
}